

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O1

void __thiscall
ConfidentialTransactionContext_SequenceApiTestWithKey_Test::TestBody
          (ConfidentialTransactionContext_SequenceApiTestWithKey_Test *this)

{
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar1;
  pointer puVar2;
  bool bVar3;
  undefined1 uVar4;
  undefined1 extraout_DL;
  long lVar5;
  char *pcVar6;
  char *in_R9;
  initializer_list<cfd::UtxoData> __l;
  AssertionResult gtest_ar_;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  txouts;
  Amount fee;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ct_addrs;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ElementsAddressFactory factory;
  AssertionResult gtest_ar;
  ConfidentialTransactionContext txc;
  ElementsConfidentialAddress address;
  UtxoData utxo2;
  UtxoData utxo1;
  ElementsConfidentialAddress asset_address;
  AssertHelper local_1938;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1930;
  undefined1 local_1928 [16];
  AssertHelper local_1918 [4];
  AssertHelper local_18f8 [2];
  undefined1 local_18e8 [16];
  ByteData local_18d8;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  local_18b8 [8];
  long local_18b0;
  Pubkey local_18a0;
  ConfidentialAssetId local_1888;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_1860;
  SigHashType local_1848 [12];
  SigHashType local_183c [12];
  undefined **local_1830 [2];
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  local_1820 [24];
  undefined1 local_1808 [32];
  uchar local_17e8 [16];
  void *local_17d8;
  void *local_17c0;
  void *local_17a8;
  code *local_1790 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_1718;
  Script local_1700;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_16c0 [19];
  UtxoData local_1318 [1264];
  OutPoint local_e28 [4];
  undefined1 *local_d70 [2];
  undefined1 local_d60 [416];
  undefined1 *local_bc0 [2];
  undefined1 local_bb0 [24];
  Txid local_b98;
  uint local_b78;
  Script local_b70 [2];
  Address local_b00 [376];
  undefined1 local_988 [8];
  char *local_980;
  undefined1 local_968 [504];
  BlindFactor local_770;
  BlindFactor local_750;
  ConfidentialValue local_730 [2];
  undefined8 local_6d0 [5];
  Txid local_6a8;
  uint local_688;
  Script local_680 [2];
  Address local_610 [376];
  undefined1 local_498 [8];
  char *local_490;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_478;
  undefined1 local_470;
  undefined4 local_468;
  undefined8 local_460;
  ConfidentialAssetId local_458 [15];
  ElementsConfidentialAddress local_1e0 [432];
  
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)local_1830,kElementsRegtest);
  cfd::UtxoData::UtxoData((UtxoData *)local_6d0);
  local_6d0[0] = 0;
  local_460 = 0;
  local_bc0[0] = local_bb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_bc0,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             "");
  cfd::core::Txid::Txid((Txid *)local_1808,(string *)local_bc0);
  cfd::core::Txid::operator=(&local_6a8,(Txid *)local_1808);
  local_1808._0_8_ = &PTR__Txid_002e1e60;
  if ((pointer)local_1808._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1808._8_8_);
  }
  if (local_bc0[0] != local_bb0) {
    operator_delete(local_bc0[0]);
  }
  local_688 = 0;
  local_bc0[0] = local_bb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_bc0,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac","");
  cfd::core::Script::Script((Script *)local_1808,(string *)local_bc0);
  cfd::core::Script::operator=(local_680,(Script *)local_1808);
  cfd::core::Script::~Script((Script *)local_1808);
  if (local_bc0[0] != local_bb0) {
    operator_delete(local_bc0[0]);
  }
  local_bc0[0] = local_bb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_bc0,"2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph","");
  cfd::AddressFactory::GetAddress((string *)local_1808);
  cfd::core::Address::operator=(local_610,(Address *)local_1808);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_16c0);
  cfd::core::Script::~Script(&local_1700);
  local_1790[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1718)
  ;
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_1790);
  if (local_17a8 != (void *)0x0) {
    operator_delete(local_17a8);
  }
  if (local_17c0 != (void *)0x0) {
    operator_delete(local_17c0);
  }
  if (local_17d8 != (void *)0x0) {
    operator_delete(local_17d8);
  }
  if ((uchar *)local_1808._16_8_ != local_17e8) {
    operator_delete((void *)local_1808._16_8_);
  }
  if (local_bc0[0] != local_bb0) {
    operator_delete(local_bc0[0]);
  }
  std::__cxx11::string::_M_replace((ulong)local_498,0,local_490,0x28cd3c);
  cfd::core::Amount::Amount((Amount *)local_1808,10000000);
  local_470 = local_1808[8];
  local_478 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_1808._0_8_;
  local_468 = 2;
  local_bc0[0] = local_bb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_bc0,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             "");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_1808,(string *)local_bc0);
  cfd::core::ConfidentialAssetId::operator=(local_458,(ConfidentialAssetId *)local_1808);
  local_1808._0_8_ = &PTR__ConfidentialAssetId_002e2170;
  if ((pointer)local_1808._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1808._8_8_);
  }
  if (local_bc0[0] != local_bb0) {
    operator_delete(local_bc0[0]);
  }
  cfd::UtxoData::UtxoData((UtxoData *)local_bc0);
  local_bc0[0] = (undefined1 *)0x0;
  local_968._24_8_ = (pointer)0x0;
  local_d70[0] = local_d60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d70,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3",
             "");
  cfd::core::Txid::Txid((Txid *)local_1808,(string *)local_d70);
  cfd::core::Txid::operator=(&local_b98,(Txid *)local_1808);
  local_1808._0_8_ = &PTR__Txid_002e1e60;
  if ((pointer)local_1808._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1808._8_8_);
  }
  if (local_d70[0] != local_d60) {
    operator_delete(local_d70[0]);
  }
  local_b78 = 0;
  local_d70[0] = local_d60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d70,"a9145d54db96a28f844a744e393fcd699d6f825b284187","");
  cfd::core::Script::Script((Script *)local_1808,(string *)local_d70);
  cfd::core::Script::operator=(local_b70,(Script *)local_1808);
  cfd::core::Script::~Script((Script *)local_1808);
  if (local_d70[0] != local_d60) {
    operator_delete(local_d70[0]);
  }
  local_d70[0] = local_d60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d70,"XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE","");
  cfd::AddressFactory::GetAddress((string *)local_1808);
  cfd::core::Address::operator=(local_b00,(Address *)local_1808);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_16c0);
  cfd::core::Script::~Script(&local_1700);
  local_1790[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1718)
  ;
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_1790);
  if (local_17a8 != (void *)0x0) {
    operator_delete(local_17a8);
  }
  if (local_17c0 != (void *)0x0) {
    operator_delete(local_17c0);
  }
  if (local_17d8 != (void *)0x0) {
    operator_delete(local_17d8);
  }
  if ((uchar *)local_1808._16_8_ != local_17e8) {
    operator_delete((void *)local_1808._16_8_);
  }
  if (local_d70[0] != local_d60) {
    operator_delete(local_d70[0]);
  }
  std::__cxx11::string::_M_replace((ulong)local_988,0,local_980,0x2521e7);
  cfd::core::Amount::Amount((Amount *)local_1808,180000);
  local_968[8] = local_1808[8];
  local_968._0_8_ = local_1808._0_8_;
  local_968._16_4_ = 6;
  local_d70[0] = local_d60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d70,"849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735",
             "");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_1808,(string *)local_d70);
  cfd::core::ConfidentialAssetId::operator=
            ((ConfidentialAssetId *)(local_968 + 0x20),(ConfidentialAssetId *)local_1808);
  local_1808._0_8_ = &PTR__ConfidentialAssetId_002e2170;
  if ((pointer)local_1808._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1808._8_8_);
  }
  if (local_d70[0] != local_d60) {
    operator_delete(local_d70[0]);
  }
  local_d70[0] = local_d60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d70,"23b44363de1069842dff58ac6c965f75af71949e58d823d7bfcc963134db0b3e",
             "");
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)local_1808,(string *)local_d70);
  cfd::core::BlindFactor::operator=(&local_770,(BlindFactor *)local_1808);
  local_1808._0_8_ = &PTR__BlindFactor_002e1f10;
  if ((pointer)local_1808._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1808._8_8_);
  }
  if (local_d70[0] != local_d60) {
    operator_delete(local_d70[0]);
  }
  local_d70[0] = local_d60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d70,"6dfe8c49f10c40cac178da4056dbf55eb11fa26e3169f41019e88252d86c42bc",
             "");
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)local_1808,(string *)local_d70);
  cfd::core::BlindFactor::operator=(&local_750,(BlindFactor *)local_1808);
  local_1808._0_8_ = &PTR__BlindFactor_002e1f10;
  if ((pointer)local_1808._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1808._8_8_);
  }
  if (local_d70[0] != local_d60) {
    operator_delete(local_d70[0]);
  }
  local_d70[0] = local_d60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d70,
             "09da970d871982c2405b2d4bff4f455e4907bedaf95c205f94015809f6bd9c59fa","");
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)local_1808,(string *)local_d70);
  cfd::core::ConfidentialValue::operator=(local_730,(ConfidentialValue *)local_1808);
  local_1808._0_8_ = &PTR__ConfidentialValue_002e2250;
  if ((pointer)local_1808._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1808._8_8_);
  }
  if (local_d70[0] != local_d60) {
    operator_delete(local_d70[0]);
  }
  sVar1.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_1808 + 0x10);
  local_1808._0_8_ = sVar1.ptr_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1808,
             "CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3ggeFikyDxDW5gU8WmTXtb2HWWjc23YXZz","");
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_d70,(string *)local_1808);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1808._0_8_ !=
      sVar1.ptr_) {
    operator_delete((void *)local_1808._0_8_);
  }
  local_1808._0_8_ = sVar1.ptr_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1808,
             "CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3VHXTF8dZAhKb1iBAnzYXEj527CSdfj2PS","");
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (local_1e0,(string *)local_1808);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1808._0_8_ !=
      sVar1.ptr_) {
    operator_delete((void *)local_1808._0_8_);
  }
  cfd::core::Amount::Amount((Amount *)&local_1888,10000);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_e28,2,0);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::ConfidentialTransactionContext::AddInput((UtxoData *)local_e28);
    }
  }
  else {
    testing::Message::Message((Message *)local_1808);
    testing::internal::AssertHelper::AssertHelper
              (&local_1938,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x2ff,
               "Expected: txc.AddInput(utxo1) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_1938,(Message *)local_1808);
    testing::internal::AssertHelper::~AssertHelper(&local_1938);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1808._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_1808._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_1808._0_8_ + 8))();
      }
      local_1808._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  cfd::core::OutPoint::OutPoint((OutPoint *)local_1808,&local_b98,local_b78);
  cfd::ConfidentialTransactionContext::AddTxIn(local_e28);
  local_1808._0_8_ = &PTR__Txid_002e1e60;
  if ((pointer)local_1808._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1808._8_8_);
  }
  local_1808._0_8_ = cfd::core::operator-((Amount *)&local_478,(Amount *)&local_1888);
  local_1808[8] = extraout_DL;
  cfd::ConfidentialTransactionContext::AddTxOut
            ((ElementsConfidentialAddress *)local_e28,(Amount *)local_d70,
             (ConfidentialAssetId *)local_1808,SUB81(local_458,0));
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress();
  cfd::ConfidentialTransactionContext::AddTxOut
            ((Address *)local_e28,(Amount *)local_1808,(ConfidentialAssetId *)local_968);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_16c0);
  cfd::core::Script::~Script(&local_1700);
  local_1790[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1718)
  ;
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_1790);
  if (local_17a8 != (void *)0x0) {
    operator_delete(local_17a8);
  }
  if (local_17c0 != (void *)0x0) {
    operator_delete(local_17c0);
  }
  if (local_17d8 != (void *)0x0) {
    operator_delete(local_17d8);
  }
  if ((uchar *)local_1808._16_8_ != local_17e8) {
    operator_delete((void *)local_1808._16_8_);
  }
  cfd::core::ConfidentialTransaction::AddTxOutFee((Amount *)local_e28,&local_1888);
  cfd::UtxoData::UtxoData((UtxoData *)local_1808,(UtxoData *)local_6d0);
  cfd::UtxoData::UtxoData(local_1318,(UtxoData *)local_bc0);
  __l._M_len = 2;
  __l._M_array = (iterator)local_1808;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&local_1860,__l,(allocator_type *)&local_1938);
  lVar5 = 0x4f0;
  do {
    cfd::UtxoData::~UtxoData((UtxoData *)(local_1808 + lVar5));
    lVar5 = lVar5 + -0x4f0;
  } while (lVar5 != -0x4f0);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::ConfidentialTransactionContext::CollectInputUtxo((vector *)local_e28);
    }
  }
  else {
    testing::Message::Message((Message *)local_1808);
    testing::internal::AssertHelper::AssertHelper
              (&local_1938,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x306,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1938,(Message *)local_1808);
    testing::internal::AssertHelper::~AssertHelper(&local_1938);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1808._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_1808._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_1808._0_8_ + 8))();
      }
      local_1808._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  local_1888.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1888.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1888.version_ = '\0';
  local_1888._33_7_ = 0;
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
               *)((long)&local_1888.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
                 8),local_1e0);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      in_R9 = (char *)0x0;
      cfd::ConfidentialTransactionContext::Blind
                ((vector *)local_e28,
                 (long)((long)&local_1888.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl + 8),1,0,(vector *)0x34);
    }
  }
  else {
    testing::Message::Message((Message *)local_1808);
    testing::internal::AssertHelper::AssertHelper
              (&local_1938,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x30a,
               "Expected: txc.Blind(&ct_addrs) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_1938,(Message *)local_1808);
    testing::internal::AssertHelper::~AssertHelper(&local_1938);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1808._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_1808._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_1808._0_8_ + 8))();
      }
      local_1808._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  cfd::core::ConfidentialTransaction::GetTxOutList();
  local_1938.data_ =
       (AssertHelperData *)((local_18b0 - (long)local_18b8 >> 3) * -0x1084210842108421);
  local_1918[0].data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1808,"txouts.size()","3",(unsigned_long *)&local_1938,
             (int *)local_1918);
  if (local_1808[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_1938);
    if ((pointer)local_1808._8_8_ == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_1808._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_1918,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x30c,pcVar6);
    testing::internal::AssertHelper::operator=(local_1918,(Message *)&local_1938);
    testing::internal::AssertHelper::~AssertHelper(local_1918);
    if (local_1938.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_1938.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_1938.data_ + 8))();
      }
      local_1938.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_1808 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  if (local_18b0 - (long)local_18b8 == 0x2e8) {
    cfd::core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)local_1808,(ConfidentialValue *)((long)local_18b8 + 0x78));
    uVar4 = cfd::core::ConfidentialValue::HasBlinding();
    local_1938.data_._0_1_ = (allocator_type)uVar4;
    local_1930.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_1808._0_8_ = &PTR__ConfidentialValue_002e2250;
    if ((pointer)local_1808._8_8_ != (pointer)0x0) {
      operator_delete((void *)local_1808._8_8_);
    }
    if (local_1938.data_._0_1_ == (allocator_type)0x0) {
      testing::Message::Message((Message *)local_1918);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1808,(internal *)&local_1938,
                 (AssertionResult *)"txouts[0].GetConfidentialValue().HasBlinding()","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (local_18f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x30e,(char *)local_1808._0_8_);
      testing::internal::AssertHelper::operator=(local_18f8,(Message *)local_1918);
      testing::internal::AssertHelper::~AssertHelper(local_18f8);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_1808._0_8_ != sVar1.ptr_) {
        operator_delete((void *)local_1808._0_8_);
      }
      if (local_1918[0].data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_1918[0].data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_1918[0].data_ + 8))();
        }
        local_1918[0].data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_1930,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)local_1808,(ConfidentialValue *)((long)local_18b8 + 0x170));
    uVar4 = cfd::core::ConfidentialValue::HasBlinding();
    local_1938.data_._0_1_ = (allocator_type)uVar4;
    local_1930.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_1808._0_8_ = &PTR__ConfidentialValue_002e2250;
    if ((pointer)local_1808._8_8_ != (pointer)0x0) {
      operator_delete((void *)local_1808._8_8_);
    }
    if (local_1938.data_._0_1_ == (allocator_type)0x0) {
      testing::Message::Message((Message *)local_1918);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1808,(internal *)&local_1938,
                 (AssertionResult *)"txouts[1].GetConfidentialValue().HasBlinding()","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (local_18f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x30f,(char *)local_1808._0_8_);
      testing::internal::AssertHelper::operator=(local_18f8,(Message *)local_1918);
      testing::internal::AssertHelper::~AssertHelper(local_18f8);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_1808._0_8_ != sVar1.ptr_) {
        operator_delete((void *)local_1808._0_8_);
      }
      if (local_1918[0].data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_1918[0].data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_1918[0].data_ + 8))();
        }
        local_1918[0].data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_1930,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)local_1808,(ConfidentialValue *)((long)local_18b8 + 0x268));
    uVar4 = cfd::core::ConfidentialValue::HasBlinding();
    local_1938.data_ = (AssertHelperData *)(CONCAT71(local_1938.data_._1_7_,uVar4) ^ 1);
    local_1930.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_1808._0_8_ = &PTR__ConfidentialValue_002e2250;
    if ((pointer)local_1808._8_8_ != (pointer)0x0) {
      operator_delete((void *)local_1808._8_8_);
    }
    if (local_1938.data_._0_1_ == (allocator_type)0x0) {
      testing::Message::Message((Message *)local_1918);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1808,(internal *)&local_1938,
                 (AssertionResult *)"txouts[2].GetConfidentialValue().HasBlinding()","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (local_18f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x310,(char *)local_1808._0_8_);
      testing::internal::AssertHelper::operator=(local_18f8,(Message *)local_1918);
      testing::internal::AssertHelper::~AssertHelper(local_18f8);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_1808._0_8_ != sVar1.ptr_) {
        operator_delete((void *)local_1808._0_8_);
      }
      if (local_1918[0].data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_1918[0].data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_1918[0].data_ + 8))();
        }
        local_1918[0].data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_1930,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  cfd::core::ByteData::ByteData(&local_18d8);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_1808,&local_6a8,local_688);
      local_1938.data_ = (AssertHelperData *)local_1928;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1938,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
      cfd::core::Pubkey::Pubkey(&local_18a0,(string *)&local_1938);
      local_18f8[0].data_ = (AssertHelperData *)local_18e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_18f8,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
      cfd::core::Privkey::FromWif((string *)local_1918,(NetType)local_18f8,true);
      cfd::core::SigHashType::SigHashType(local_183c);
      cfd::ConfidentialTransactionContext::SignWithKey
                (local_e28,local_1808,&local_18a0,local_1918,local_183c,1);
      if (local_1918[0].data_ != (AssertHelperData *)0x0) {
        operator_delete(local_1918[0].data_);
      }
      if (local_18f8[0].data_ != (AssertHelperData *)local_18e8) {
        operator_delete(local_18f8[0].data_);
      }
      if (local_18a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_18a0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_1938.data_ != (AssertHelperData *)local_1928) {
        operator_delete(local_1938.data_);
      }
      local_1808._0_8_ = &PTR__Txid_002e1e60;
      if ((pointer)local_1808._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_1808._8_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_1808);
    testing::internal::AssertHelper::AssertHelper
              (&local_1938,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x318,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1938,(Message *)local_1808);
    testing::internal::AssertHelper::~AssertHelper(&local_1938);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1808._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_1808._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_1808._0_8_ + 8))();
      }
      local_1808._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_1808,&local_6a8,local_688);
      cfd::ConfidentialTransactionContext::Verify(local_e28);
      local_1808._0_8_ = &PTR__Txid_002e1e60;
      if ((pointer)local_1808._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_1808._8_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_1808);
    testing::internal::AssertHelper::AssertHelper
              (&local_1938,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x319,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1938,(Message *)local_1808);
    testing::internal::AssertHelper::~AssertHelper(&local_1938);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1808._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_1808._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_1808._0_8_ + 8))();
      }
      local_1808._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    cfd::ConfidentialTransactionContext::Finalize();
    puVar2 = local_18d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_18d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_1808._0_8_;
    local_18d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_1808._8_8_;
    local_18d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_1808._16_8_;
    local_1808._0_8_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_1808._8_8_ = (pointer)0x0;
    local_1808._16_8_ = (uchar *)0x0;
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar2 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(puVar2);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1808._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete((void *)local_1808._0_8_);
    }
  }
  testing::Message::Message((Message *)local_1808);
  testing::internal::AssertHelper::AssertHelper
            (&local_1938,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
             ,0x31b,
             "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_1938,(Message *)local_1808);
  testing::internal::AssertHelper::~AssertHelper(&local_1938);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1808._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1808._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(_func_int **)local_1808._0_8_ + 8))();
    }
    local_1808._0_8_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_1808,&local_b98,local_b78);
      local_1938.data_ = (AssertHelperData *)local_1928;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1938,
                 "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27","");
      cfd::core::Pubkey::Pubkey(&local_18a0,(string *)&local_1938);
      local_18f8[0].data_ = (AssertHelperData *)local_18e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_18f8,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP","");
      cfd::core::Privkey::FromWif((string *)local_1918,(NetType)local_18f8,true);
      cfd::core::SigHashType::SigHashType(local_1848);
      cfd::ConfidentialTransactionContext::SignWithKey
                (local_e28,local_1808,&local_18a0,local_1918,local_1848,1);
      if (local_1918[0].data_ != (AssertHelperData *)0x0) {
        operator_delete(local_1918[0].data_);
      }
      if (local_18f8[0].data_ != (AssertHelperData *)local_18e8) {
        operator_delete(local_18f8[0].data_);
      }
      if (local_18a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_18a0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_1938.data_ != (AssertHelperData *)local_1928) {
        operator_delete(local_1938.data_);
      }
      local_1808._0_8_ = &PTR__Txid_002e1e60;
      if ((pointer)local_1808._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_1808._8_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_1808);
    testing::internal::AssertHelper::AssertHelper
              (&local_1938,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,800,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1938,(Message *)local_1808);
    testing::internal::AssertHelper::~AssertHelper(&local_1938);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1808._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_1808._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_1808._0_8_ + 8))();
      }
      local_1808._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_1808,&local_b98,local_b78);
      cfd::ConfidentialTransactionContext::Verify(local_e28);
      local_1808._0_8_ = &PTR__Txid_002e1e60;
      if ((pointer)local_1808._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_1808._8_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_1808);
    testing::internal::AssertHelper::AssertHelper
              (&local_1938,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x321,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1938,(Message *)local_1808);
    testing::internal::AssertHelper::~AssertHelper(&local_1938);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1808._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_1808._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_1808._0_8_ + 8))();
      }
      local_1808._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::ConfidentialTransactionContext::Finalize();
      puVar2 = local_18d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_18d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_1808._0_8_;
      local_18d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_1808._8_8_;
      local_18d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_1808._16_8_;
      local_1808._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_1808._8_8_ = (pointer)0x0;
      local_1808._16_8_ = (uchar *)0x0;
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar2 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(puVar2);
      }
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_1808._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete((void *)local_1808._0_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_1808);
    testing::internal::AssertHelper::AssertHelper
              (&local_1938,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x322,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_1938,(Message *)local_1808);
    testing::internal::AssertHelper::~AssertHelper(&local_1938);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1808._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_1808._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_1808._0_8_ + 8))();
      }
      local_1808._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  lVar5 = cfd::core::ByteData::GetDataSize();
  if (((lVar5 != 0x23e1) && (lVar5 = cfd::core::ByteData::GetDataSize(), lVar5 != 0x23e2)) &&
     (lVar5 = cfd::core::ByteData::GetDataSize(), lVar5 != 0x23e3)) {
    local_1918[0].data_ = local_1918[0].data_ & 0xffffffff00000000;
    local_1938.data_ = (AssertHelperData *)cfd::core::ByteData::GetDataSize();
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)local_1808,"0","tx.GetDataSize()",(int *)local_1918,
               (unsigned_long *)&local_1938);
    if (local_1808[0] == (string)0x0) {
      testing::Message::Message((Message *)&local_1938);
      if ((pointer)local_1808._8_8_ == (pointer)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)local_1808._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (local_1918,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x325,pcVar6);
      testing::internal::AssertHelper::operator=(local_1918,(Message *)&local_1938);
      testing::internal::AssertHelper::~AssertHelper(local_1918);
      if (local_1938.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_1938.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_1938.data_ + 8))();
        }
        local_1938.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_1808 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_18d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_18d8.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector(local_18b8);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::~vector((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
             *)((long)&local_1888.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 8
               ));
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_1860);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_e28);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(local_1e0);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_d70);
  cfd::UtxoData::~UtxoData((UtxoData *)local_bc0);
  cfd::UtxoData::~UtxoData((UtxoData *)local_6d0);
  local_1830[0] = &PTR__AddressFactory_002dffd8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (local_1820);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, SequenceApiTestWithKey)
{
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{10000000});
  utxo1.address_type = AddressType::kP2pkhAddress;
  utxo1.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  // utxo1.asset_blind_factor = BlindFactor("");
  // utxo1.amount_blind_factor = BlindFactor("");
  // utxo1.value_commitment = ConfidentialValue("");

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  // blinding key: '66e4df5035a64acef16b4aa52ddc8bebd22b22c9eca150774e355abc72909d83'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{180000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;
  utxo2.asset = ConfidentialAssetId("849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735");
  // utxo2.confidential_address;
  utxo2.asset_blind_factor = BlindFactor("23b44363de1069842dff58ac6c965f75af71949e58d823d7bfcc963134db0b3e");
  utxo2.amount_blind_factor = BlindFactor("6dfe8c49f10c40cac178da4056dbf55eb11fa26e3169f41019e88252d86c42bc");
  utxo2.value_commitment = ConfidentialValue("09da970d871982c2405b2d4bff4f455e4907bedaf95c205f94015809f6bd9c59fa");

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  ElementsConfidentialAddress address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3ggeFikyDxDW5gU8WmTXtb2HWWjc23YXZz");
  // "2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z"
  ElementsConfidentialAddress asset_address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3VHXTF8dZAhKb1iBAnzYXEj527CSdfj2PS");

  Amount fee(int64_t{10000});
  ConfidentialTransactionContext txc(2, 0);
  EXPECT_NO_THROW(txc.AddInput(utxo1));
  txc.AddTxIn(OutPoint(utxo2.txid, utxo2.vout));
  txc.AddTxOut(address, utxo1.amount - fee, utxo1.asset);
  txc.AddTxOut(asset_address.GetUnblindedAddress(), utxo2.amount, utxo2.asset);
  txc.AddTxOutFee(fee, utxo1.asset);

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2};
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  std::vector<cfd::core::ElementsConfidentialAddress> ct_addrs;
  ct_addrs.push_back(asset_address);
  EXPECT_NO_THROW(txc.Blind(&ct_addrs));
  std::vector<ConfidentialTxOutReference> txouts = txc.GetTxOutList();
  EXPECT_EQ(txouts.size(), 3);
  if (txouts.size() == 3) {
    EXPECT_TRUE(txouts[0].GetConfidentialValue().HasBlinding());
    EXPECT_TRUE(txouts[1].GetConfidentialValue().HasBlinding());
    EXPECT_FALSE(txouts[2].GetConfidentialValue().HasBlinding());
  }

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));

  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));
  EXPECT_NO_THROW(tx = txc.Finalize());

  if ((tx.GetDataSize() != 9185) && (tx.GetDataSize() != 9186) && (tx.GetDataSize() != 9187)) {
    EXPECT_EQ(0, tx.GetDataSize());
  }
}